

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
CheckAndStoreTopologySplitEvent
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int src_symbol_id,int param_2,EdgeFaceName src_edge,int neighbor_face_id)

{
  TopologySplitEventData event_data;
  value_type local_24;
  
  local_24.split_symbol_id = GetSplitSymbolIdOnFace(this,neighbor_face_id);
  if (local_24.split_symbol_id != 0xffffffff) {
    local_24._8_1_ = src_edge & RIGHT_FACE_EDGE;
    local_24.source_symbol_id = src_symbol_id;
    std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
    push_back(&this->topology_split_event_data_,&local_24);
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::CheckAndStoreTopologySplitEvent(int src_symbol_id,
                                                       int /* src_face_id */,
                                                       EdgeFaceName src_edge,
                                                       int neighbor_face_id) {
  const int symbol_id = GetSplitSymbolIdOnFace(neighbor_face_id);
  if (symbol_id == -1) {
    return;  // Not a split symbol, no topology split event could happen.
  }
  TopologySplitEventData event_data;

  event_data.split_symbol_id = symbol_id;
  event_data.source_symbol_id = src_symbol_id;
  event_data.source_edge = src_edge;
  topology_split_event_data_.push_back(event_data);
}